

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmMakefileTargetGenerator::WriteObjectsVariable
          (cmMakefileTargetGenerator *this,string *variableName,string *variableNameExternal,
          bool useWatcomQuote)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmLocalUnixMakefileGenerator3 *pcVar2;
  cmGeneratedFileStream *pcVar3;
  cmMakefile *this_00;
  pointer pbVar4;
  pointer pcVar5;
  string *psVar6;
  ostream *poVar7;
  char *pcVar8;
  size_t sVar9;
  string *psVar10;
  string *obj;
  pointer pbVar11;
  char *__s;
  string currentBinDir;
  string object;
  string local_a0;
  uint local_7c;
  string local_78;
  string *local_58;
  string local_50;
  
  pcVar2 = this->LocalGenerator;
  psVar6 = cmGeneratorTarget::GetName_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"_OBJECTS","");
  cmLocalUnixMakefileGenerator3::CreateMakeVariable(&local_78,pcVar2,psVar6,&local_a0);
  std::__cxx11::string::operator=((string *)variableName,(string *)&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = this->BuildFileStream;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)pcVar3,"# Object files for target ",0x1a);
  psVar6 = cmGeneratorTarget::GetName_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)pcVar3,(psVar6->_M_dataplus)._M_p,psVar6->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,(variableName->_M_dataplus)._M_p,variableName->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," =",2);
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  this_00 = (this->super_cmCommonTargetGenerator).Makefile;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"CMAKE_MAKE_LINE_CONTINUE","")
  ;
  local_58 = variableNameExternal;
  pcVar8 = cmMakefile::GetDefinition(this_00,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  __s = "\\";
  if (pcVar8 != (char *)0x0) {
    __s = pcVar8;
  }
  pbVar11 = (this->Objects).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar4 = (this->Objects).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_7c = (uint)useWatcomQuote;
  if (pbVar11 != pbVar4) {
    do {
      pcVar3 = this->BuildFileStream;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar3," ",1);
      sVar9 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar3,__s,sVar9);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar3,"\n",1);
      pcVar3 = this->BuildFileStream;
      cmLocalUnixMakefileGenerator3::ConvertToQuotedOutputPath(&local_a0,pbVar11,SUB41(local_7c,0));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pcVar3,local_a0._M_dataplus._M_p,local_a0._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      pbVar11 = pbVar11 + 1;
    } while (pbVar11 != pbVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this->BuildFileStream,"\n",1);
  psVar6 = local_58;
  pcVar2 = this->LocalGenerator;
  psVar10 = cmGeneratorTarget::GetName_abi_cxx11_
                      ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"_EXTERNAL_OBJECTS","");
  cmLocalUnixMakefileGenerator3::CreateMakeVariable(&local_a0,pcVar2,psVar10,&local_50);
  std::__cxx11::string::operator=((string *)psVar6,(string *)&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = this->BuildFileStream;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)pcVar3,"# External object files for target ",0x23);
  psVar10 = cmGeneratorTarget::GetName_abi_cxx11_
                      ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)pcVar3,(psVar10->_M_dataplus)._M_p,psVar10->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,(psVar6->_M_dataplus)._M_p,psVar6->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," =",2);
  psVar6 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                     ((cmLocalGenerator *)this->LocalGenerator);
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  pcVar5 = (psVar6->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,pcVar5,pcVar5 + psVar6->_M_string_length);
  pbVar11 = (this->ExternalObjects).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_58 = (this->ExternalObjects).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar11 != local_58) {
    do {
      cmLocalGenerator::MaybeConvertToRelativePath
                (&local_50,(cmLocalGenerator *)this->LocalGenerator,&local_a0,pbVar11);
      std::__cxx11::string::operator=((string *)&local_78,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar1) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      pcVar3 = this->BuildFileStream;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar3," ",1);
      sVar9 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar3,__s,sVar9);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar3,"\n",1);
      pcVar3 = this->BuildFileStream;
      cmLocalUnixMakefileGenerator3::ConvertToQuotedOutputPath(&local_50,pbVar11,SUB41(local_7c,0));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pcVar3,local_50._M_dataplus._M_p,local_50._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar1) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      pbVar11 = pbVar11 + 1;
    } while (pbVar11 != local_58);
  }
  pcVar3 = this->BuildFileStream;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar3,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void cmMakefileTargetGenerator::WriteObjectsVariable(
  std::string& variableName, std::string& variableNameExternal,
  bool useWatcomQuote)
{
  // Write a make variable assignment that lists all objects for the
  // target.
  variableName = this->LocalGenerator->CreateMakeVariable(
    this->GeneratorTarget->GetName(), "_OBJECTS");
  *this->BuildFileStream << "# Object files for target "
                         << this->GeneratorTarget->GetName() << "\n"
                         << variableName << " =";
  std::string object;
  const char* lineContinue =
    this->Makefile->GetDefinition("CMAKE_MAKE_LINE_CONTINUE");
  if (!lineContinue) {
    lineContinue = "\\";
  }
  for (std::string const& obj : this->Objects) {
    *this->BuildFileStream << " " << lineContinue << "\n";
    *this->BuildFileStream
      << cmLocalUnixMakefileGenerator3::ConvertToQuotedOutputPath(
           obj, useWatcomQuote);
  }
  *this->BuildFileStream << "\n";

  // Write a make variable assignment that lists all external objects
  // for the target.
  variableNameExternal = this->LocalGenerator->CreateMakeVariable(
    this->GeneratorTarget->GetName(), "_EXTERNAL_OBJECTS");
  /* clang-format off */
  *this->BuildFileStream
    << "\n"
    << "# External object files for target "
    << this->GeneratorTarget->GetName() << "\n"
    << variableNameExternal << " =";
  /* clang-format on */
  std::string currentBinDir =
    this->LocalGenerator->GetCurrentBinaryDirectory();
  for (std::string const& obj : this->ExternalObjects) {
    object =
      this->LocalGenerator->MaybeConvertToRelativePath(currentBinDir, obj);
    *this->BuildFileStream << " " << lineContinue << "\n";
    *this->BuildFileStream
      << cmLocalUnixMakefileGenerator3::ConvertToQuotedOutputPath(
           obj, useWatcomQuote);
  }
  *this->BuildFileStream << "\n"
                         << "\n";
}